

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool_extension.cpp
# Opt level: O0

uint64 __thiscall
dlib::thread_pool_implementation::add_task_internal
          (thread_pool_implementation *this,bfp_type *bfp,
          shared_ptr<dlib::thread_pool_implementation::function_object_copy> *item)

{
  bool bVar1;
  array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
  *paVar2;
  task_state_type *ptVar3;
  uint64 uVar4;
  int in_EDX;
  __sighandler_t __handler;
  bound_function_pointer *in_RSI;
  array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
  *__stat_loc;
  array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
  *in_RDI;
  long idx;
  thread_id_type my_thread_id;
  auto_mutex M;
  __shared_ptr<dlib::thread_pool_implementation::function_object_copy,_(__gnu_cxx::_Lock_policy)2>
  *in_stack_ffffffffffffff38;
  auto_mutex *in_stack_ffffffffffffff40;
  long in_stack_ffffffffffffff48;
  thread_pool_implementation *in_stack_ffffffffffffff50;
  thread_pool_implementation *in_stack_ffffffffffffff58;
  thread_pool_implementation *in_stack_ffffffffffffff68;
  size_t local_58;
  array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
  *this_00;
  uint64 local_8;
  
  __stat_loc = in_RDI + 2;
  this_00 = in_RDI;
  auto_mutex::auto_mutex(in_stack_ffffffffffffff40,(mutex *)in_stack_ffffffffffffff38);
  paVar2 = (array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
            *)get_thread_id();
  local_58 = find_empty_task_slot(in_stack_ffffffffffffff68);
  if ((local_58 == 0xffffffffffffffff) &&
     (__stat_loc = paVar2,
     bVar1 = is_worker_thread(in_stack_ffffffffffffff58,(thread_id_type)in_stack_ffffffffffffff50),
     bVar1)) {
    auto_mutex::unlock(in_stack_ffffffffffffff40);
    bound_function_pointer::operator()((bound_function_pointer *)0x29d647);
    local_8 = 1;
  }
  else {
    while (local_58 == 0xffffffffffffffff) {
      signaler::wait((signaler *)&in_RDI[2].pos,__stat_loc);
      local_58 = find_empty_task_slot(in_stack_ffffffffffffff68);
    }
    ptVar3 = array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
             ::operator[](in_RDI,local_58);
    ptVar3->thread_id = (thread_id_type)paVar2;
    uVar4 = make_next_task_id(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    ptVar3 = array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
             ::operator[](in_RDI,local_58);
    ptVar3->task_id = uVar4;
    array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
    ::operator[](in_RDI,local_58);
    bound_function_pointer::operator=((bound_function_pointer *)this_00,in_RSI);
    ptVar3 = array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
             ::operator[](in_RDI,local_58);
    std::
    __shared_ptr<dlib::thread_pool_implementation::function_object_copy,_(__gnu_cxx::_Lock_policy)2>
    ::swap((__shared_ptr<dlib::thread_pool_implementation::function_object_copy,_(__gnu_cxx::_Lock_policy)2>
            *)ptVar3,in_stack_ffffffffffffff38);
    signaler::signal((signaler *)&in_RDI[3].pos,in_EDX,__handler);
    ptVar3 = array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
             ::operator[](in_RDI,local_58);
    local_8 = ptVar3->task_id;
  }
  auto_mutex::~auto_mutex((auto_mutex *)0x29d7e1);
  return local_8;
}

Assistant:

uint64 thread_pool_implementation::
    add_task_internal (
        const bfp_type& bfp,
        std::shared_ptr<function_object_copy>& item
    )
    {
        auto_mutex M(m);
        const thread_id_type my_thread_id = get_thread_id();

        // find a thread that isn't doing anything
        long idx = find_empty_task_slot();
        if (idx == -1 && is_worker_thread(my_thread_id))
        {
            // this function is being called from within a worker thread and there
            // aren't any other worker threads free so just perform the task right
            // here

            M.unlock();
            bfp();

            // return a task id that is both non-zero and also one
            // that is never normally returned.  This way calls
            // to wait_for_task() will never block given this id.
            return 1;
        }

        // wait until there is a thread that isn't doing anything
        while (idx == -1)
        {
            task_done_signaler.wait();
            idx = find_empty_task_slot();
        }

        tasks[idx].thread_id = my_thread_id;
        tasks[idx].task_id = make_next_task_id(idx);
        tasks[idx].bfp = bfp;
        tasks[idx].function_copy.swap(item);

        task_ready_signaler.signal();

        return tasks[idx].task_id;
    }